

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O3

string * __thiscall
CppEphem::StrOpt::join_angle_abi_cxx11_
          (string *__return_storage_ptr__,StrOpt *this,
          vector<double,_std::allocator<double>_> *values,char *delim)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  _Setprecision _Var3;
  const_reference pvVar4;
  size_type sVar5;
  ostream *poVar6;
  ostringstream ss;
  double local_1a0;
  ostringstream local_198 [376];
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)this,2);
  local_1a0 = *pvVar4;
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)this);
  if (sVar5 == 4) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this,3);
    local_1a0 = local_1a0 + *pvVar4;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar6 = std::operator<<(poVar6,_Var2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)this,0);
  std::ostream::operator<<(poVar6,(int)*pvVar4);
  std::operator<<((ostream *)local_198,
                  *(char *)&(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar6 = std::operator<<(poVar6,_Var2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)this,1);
  std::ostream::operator<<(poVar6,(int)*pvVar4);
  std::operator<<((ostream *)local_198,
                  *(char *)&(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(0xb);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
  _Var3 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,local_1a0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string CppEphem::StrOpt::join_angle(const std::vector<double>& values,
                                         const char&                delim)
{
    // Make sure there are only three values
    double sec = values[2];
    if (values.size() == 4) {
        sec += values[3];
    }

    // Assemble the string using the specified delimiter
    std::ostringstream ss;
    ss << std::setfill('0') << std::setw(2) << int(values[0]);
    ss << delim;
    ss << std::setfill('0') << std::setw(2) << int(values[1]);
    ss << delim;
    ss << std::setfill('0') << std::setw(11) << std::fixed 
       << std::setprecision(8) << sec;
    
    return std::string(ss.str());
}